

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

int Gia_MuxDeref_rec(Gia_Man_t *p,int iObj)

{
  int *piVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  
  iVar6 = 0;
  while( true ) {
    if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[iObj] == 0)) {
      return iVar6;
    }
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar7 = p->pObjs + (uint)iObj;
    piVar1 = p->pRefs + (uint)iObj;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return iVar6;
    }
    if (p->nObjs <= iObj) break;
    iVar4 = Gia_MuxDeref_rec(p,iObj - (*(uint *)pGVar7 & 0x1fffffff));
    pGVar3 = p->pObjs;
    if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) break;
    iVar5 = Gia_MuxDeref_rec(p,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555 -
                               (*(uint *)&pGVar7->field_0x4 & 0x1fffffff));
    iObj = 0xffffffff;
    if (p->pMuxes != (uint *)0x0) {
      pGVar3 = p->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) break;
      uVar2 = p->pMuxes[(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555];
      if (uVar2 != 0) {
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        iObj = uVar2 >> 1;
      }
    }
    iVar6 = iVar6 + iVar4 + iVar5 + 1;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_MuxDeref_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjRefDec(p, pObj) )
        return 0;
    return Gia_MuxDeref_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}